

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

StringRef __thiscall llvm::Triple::getARMCPUForArch(Triple *this,StringRef MArch)

{
  OSType OVar1;
  StringRef SVar2;
  StringRef SVar3;
  StringRef SVar4;
  StringRef SVar5;
  StringRef SVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  ARM *this_00;
  int *piVar9;
  StringRef SVar10;
  StringRef Arch;
  
  if (MArch.Length == 0) {
    MArch = getArchName(this);
  }
  SVar10.Length = (char *)MArch.Length;
  SVar10.Data = SVar10.Length;
  SVar10 = ARM::getCanonicalArchName((ARM *)MArch.Data,SVar10);
  Arch.Length = (char *)SVar10.Length;
  this_00 = (ARM *)SVar10.Data;
  switch(this->OS) {
  case FreeBSD:
  case NetBSD:
    if (Arch.Length == (char *)0x0) goto LAB_0018a950;
    if ((Arch.Length == (char *)0x2) && (*(short *)this_00 == 0x3676)) goto LAB_0018a966;
    break;
  case IOS:
  case MacOSX:
switchD_0018a87a_caseD_7:
    if (Arch.Length == (char *)0x0) goto LAB_0018a950;
    if ((Arch.Length == (char *)0x3) && (this_00[2] == (ARM)0x6b && *(short *)this_00 == 0x3776)) {
      Arch.Length = "cortex-a7";
      goto LAB_0018a947;
    }
    break;
  case Win32:
    Arch.Length = "cortex-a9";
    goto LAB_0018a947;
  default:
    if (this->OS - TvOS < 2) goto switchD_0018a87a_caseD_7;
  case Fuchsia:
  case KFreeBSD:
  case Linux:
  case Lv2:
  case OpenBSD:
  case Solaris:
    if (Arch.Length == (char *)0x0) {
      Arch.Length = (char *)0x0;
LAB_0018a950:
      auVar7._8_8_ = 0;
      auVar7._0_8_ = Arch.Length;
      return (StringRef)(auVar7 << 0x40);
    }
  }
  Arch.Data = Arch.Length;
  SVar10 = ARM::getDefaultCPU(this_00,Arch);
  piVar9 = (int *)SVar10.Data;
  if (SVar10.Length != 0) {
    if (SVar10.Length != 7) {
      return SVar10;
    }
    SVar3.Length = 7;
    SVar3.Data = (char *)piVar9;
    if (*(int *)((long)piVar9 + 3) != 0x64696c61 || *piVar9 != 0x61766e69) {
      return SVar3;
    }
  }
  OVar1 = this->OS;
  Arch.Length = "cortex-a8";
  if ((OVar1 != NaCl) && (OVar1 != OpenBSD)) {
    if (OVar1 != NetBSD) {
      if ((MuslEABIHF < this->Environment) ||
         ((0x2220U >> (this->Environment & (Cygnus|Itanium)) & 1) == 0)) {
        SVar6.Length = 8;
        SVar6.Data = "arm7tdmi";
        return SVar6;
      }
LAB_0018a966:
      SVar5.Length = 0xc;
      SVar5.Data = "arm1176jzf-s";
      return SVar5;
    }
    uVar8 = this->Environment - GNUEABI;
    if (uVar8 < 6) {
      SVar4.Length = *(size_t *)(&DAT_001c8be0 + (ulong)uVar8 * 8);
      SVar4.Data = &DAT_001c8c10 + *(int *)(&DAT_001c8c10 + (ulong)uVar8 * 4);
      return SVar4;
    }
    Arch.Length = "strongarm";
  }
LAB_0018a947:
  SVar2.Length = 9;
  SVar2.Data = Arch.Length;
  return SVar2;
}

Assistant:

StringRef Triple::getARMCPUForArch(StringRef MArch) const {
  if (MArch.empty())
    MArch = getArchName();
  MArch = ARM::getCanonicalArchName(MArch);

  // Some defaults are forced.
  switch (getOS()) {
  case llvm::Triple::FreeBSD:
  case llvm::Triple::NetBSD:
    if (!MArch.empty() && MArch == "v6")
      return "arm1176jzf-s";
    break;
  case llvm::Triple::Win32:
    // FIXME: this is invalid for WindowsCE
    return "cortex-a9";
  case llvm::Triple::MacOSX:
  case llvm::Triple::IOS:
  case llvm::Triple::WatchOS:
  case llvm::Triple::TvOS:
    if (MArch == "v7k")
      return "cortex-a7";
    break;
  default:
    break;
  }

  if (MArch.empty())
    return StringRef();

  StringRef CPU = ARM::getDefaultCPU(MArch);
  if (!CPU.empty() && !CPU.equals("invalid"))
    return CPU;

  // If no specific architecture version is requested, return the minimum CPU
  // required by the OS and environment.
  switch (getOS()) {
  case llvm::Triple::NetBSD:
    switch (getEnvironment()) {
    case llvm::Triple::GNUEABIHF:
    case llvm::Triple::GNUEABI:
    case llvm::Triple::EABIHF:
    case llvm::Triple::EABI:
      return "arm926ej-s";
    default:
      return "strongarm";
    }
  case llvm::Triple::NaCl:
  case llvm::Triple::OpenBSD:
    return "cortex-a8";
  default:
    switch (getEnvironment()) {
    case llvm::Triple::EABIHF:
    case llvm::Triple::GNUEABIHF:
    case llvm::Triple::MuslEABIHF:
      return "arm1176jzf-s";
    default:
      return "arm7tdmi";
    }
  }

  llvm_unreachable("invalid arch name");
}